

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

MessageBuilder * __thiscall el::base::MessageBuilder::operator<<(MessageBuilder *this,char *msg)

{
  std::operator<<((ostream *)&this->m_logger->field_0x50,msg);
  if ((*(byte *)(elStorage + 0x19) & 0x20) != 0) {
    std::operator<<((ostream *)&this->m_logger->field_0x50," ");
  }
  return this;
}

Assistant:

inline MessageBuilder& operator<<(const std::wstring& msg) {
    return operator<<(msg.c_str());
  }